

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

void __thiscall
gmlc::networking::AsioContextManager::AsioContextManager
          (AsioContextManager *this,string *contextName)

{
  unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  __integral_type_conflict in_stack_ffffffffffffffcc;
  undefined1 __i;
  
  std::enable_shared_from_this<gmlc::networking::AsioContextManager>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::AsioContextManager> *)0x6e3c41);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl =
       (work *)&PTR__AsioContextManager_009462f0;
  std::atomic<int>::atomic((atomic<int> *)in_RDI,in_stack_ffffffffffffffcc);
  __i = (undefined1)((uint)in_stack_ffffffffffffffcc >> 0x18);
  std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  std::make_unique<asio::io_context>();
  std::unique_ptr<asio::io_context::work,std::default_delete<asio::io_context::work>>::
  unique_ptr<std::default_delete<asio::io_context::work>,void>(in_RDI);
  *(undefined1 *)
   &in_RDI[10]._M_t.
    super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t
    .super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
    super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = 0;
  std::atomic<gmlc::networking::AsioContextManager::loop_mode>::atomic
            ((atomic<gmlc::networking::AsioContextManager::loop_mode> *)
             ((long)&in_RDI[10]._M_t.
                     super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
                     .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl + 4),
             stopped);
  std::mutex::mutex((mutex *)0x6e3cb9);
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,(bool)__i);
  std::shared_future<void>::shared_future((shared_future<void> *)0x6e3cdd);
  return;
}

Assistant:

AsioContextManager::AsioContextManager(const std::string& contextName) :
    name(contextName), ictx(std::make_unique<asio::io_context>())
{
}